

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::ConvertTo
          (CECoordinates *this,CECoordinateType output_coord_type,CEObserver *observer,CEDate *date)

{
  CEObserver *in_RCX;
  double in_RSI;
  CECoordinates *in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  CECoordinateType in_stack_00000034;
  CECoordinates *in_stack_00000038;
  double in_stack_00000050;
  double in_stack_00000058;
  double in_stack_00000060;
  CEDate tmpdate;
  CEDate *in_stack_ffffffffffffff08;
  CEDate *in_stack_ffffffffffffff10;
  CECoordinates *relative_humidity;
  
  relative_humidity = in_RDI;
  CEDate::CEDate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  CEDate::operator_cast_to_double((CEDate *)0x14efe3);
  CEObserver::Longitude_Rad(in_RCX);
  CEObserver::Latitude_Rad(in_RCX);
  CEObserver::Elevation_m(in_RCX);
  CEObserver::Pressure_hPa(in_RCX);
  CEObserver::Temperature_C(in_RCX);
  CEObserver::RelativeHumidity(in_RCX);
  CEDate::dut1((CEDate *)0x14f079);
  CEDate::xpolar((CEDate *)0x14f08e);
  CEDate::ypolar((CEDate *)0x14f0a3);
  CEObserver::Wavelength_um(in_RCX);
  ConvertTo(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020,
            in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
            (double)relative_humidity,in_RSI,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  CEDate::~CEDate((CEDate *)0x14f144);
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::ConvertTo(CECoordinateType output_coord_type,
                                       const CEObserver& observer, 
                                       const CEDate& date)
{
    CEDate tmpdate(date);
    return ConvertTo(output_coord_type,
                     tmpdate,
                     observer.Longitude_Rad(),
                     observer.Latitude_Rad(),
                     observer.Elevation_m(),
                     observer.Pressure_hPa(),
                     observer.Temperature_C(),
                     observer.RelativeHumidity(),
                     tmpdate.dut1(),
                     tmpdate.xpolar(),
                     tmpdate.ypolar(),
                     observer.Wavelength_um()) ;
}